

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::ReorderingBuffer::appendZeroCC(ReorderingBuffer *this,UChar32 c,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  int iVar3;
  UChar *pUVar4;
  int appendLength;
  
  appendLength = 2 - (uint)((uint)c < 0x10000);
  iVar3 = this->remainingCapacity;
  if (iVar3 < appendLength) {
    UVar2 = resize(this,appendLength,errorCode);
    if (UVar2 == '\0') {
      return '\0';
    }
    iVar3 = this->remainingCapacity;
  }
  this->remainingCapacity = iVar3 - appendLength;
  if ((uint)c < 0x10000) {
    pUVar1 = this->limit;
    pUVar4 = pUVar1 + 1;
    this->limit = pUVar4;
    *pUVar1 = (UChar)c;
  }
  else {
    pUVar4 = this->limit;
    *pUVar4 = (short)((uint)c >> 10) + L'ퟀ';
    pUVar4[1] = (UChar)c & 0x3ffU | 0xdc00;
    pUVar4 = pUVar4 + 2;
    this->limit = pUVar4;
  }
  this->lastCC = '\0';
  this->reorderStart = pUVar4;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::appendZeroCC(UChar32 c, UErrorCode &errorCode) {
    int32_t cpLength=U16_LENGTH(c);
    if(remainingCapacity<cpLength && !resize(cpLength, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=cpLength;
    if(cpLength==1) {
        *limit++=(UChar)c;
    } else {
        limit[0]=U16_LEAD(c);
        limit[1]=U16_TRAIL(c);
        limit+=2;
    }
    lastCC=0;
    reorderStart=limit;
    return TRUE;
}